

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>
               (bit_array *x,default_cost_type<double> *c,int variables,int value_if_0)

{
  double dVar1;
  ulong uVar2;
  
  if (variables != 0) {
    uVar2 = 0;
    do {
      dVar1 = (c->linear_elements)._M_t.
              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar2];
      if ((0.0 < dVar1) || (value_if_0 != 0 && dVar1 == 0.0)) {
        bit_array_impl::set(&x->super_bit_array_impl,(int)uVar2);
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,(int)uVar2);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)variables != uVar2);
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}